

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::mult(Matrix *this,Matrix *m)

{
  int row;
  int col;
  Matrix *this_00;
  int local_6c;
  int local_68;
  int k;
  int j;
  int i;
  allocator local_49;
  string local_48;
  Matrix *n;
  Matrix *m_local;
  Matrix *this_local;
  
  n = m;
  m_local = this;
  this_00 = (Matrix *)operator_new(0x30);
  row = this->rowNo;
  col = n->colNo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"result of multiply of two matrix:",&local_49);
  Matrix(this_00,row,col,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (this->colNo == n->rowNo) {
    for (k = 0; this_local = this_00, k < this->rowNo; k = k + 1) {
      for (local_68 = 0; local_68 < n->colNo; local_68 = local_68 + 1) {
        for (local_6c = 0; local_6c < this->colNo; local_6c = local_6c + 1) {
          this_00->array[k][local_68] =
               this->array[k][local_6c] * n->array[local_6c][local_68] + this_00->array[k][local_68]
          ;
        }
      }
    }
  }
  else {
    this_local = (Matrix *)0x0;
  }
  return this_local;
}

Assistant:

Matrix* Matrix::mult(Matrix *m)
{

    Matrix *n = new Matrix(rowNo, m->colNo, "result of multiply of two matrix:");
    if (colNo == m->rowNo)
    {

        for (int i = 0; i < rowNo; i++)
        {
            for (int j = 0; j < m->colNo; j++)
            {
                for (int k = 0; k < colNo; k++)
                {
                    n->array[i][j]  = array[i][k] * m->array[k][j] + n->array[i][j];
                }
            }
        }

    }

    else
    {
        return 0;

    }
    return n;
}